

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1bf255::FilteredDirectoryContentsTask::inputsAvailable
          (FilteredDirectoryContentsTask *this,TaskInterface ti)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Kind KVar1;
  pointer pSVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pSVar5;
  bool bVar6;
  MATCH_RESULT MVar7;
  FileInfo *this_01;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  Child CVar11;
  uint64_t *puVar12;
  FileInfo *pFVar13;
  pointer pSVar14;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  byte bVar17;
  StringRef SVar18;
  error_code eVar19;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  error_code ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filterStrings;
  string filename;
  allocator local_1fa;
  allocator local_1f9;
  TaskInterface local_1f8;
  error_code local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  directory_iterator local_1b8;
  undefined1 local_1a0 [32];
  uint64_t local_180;
  uint64_t local_178;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_150;
  Child local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  Child CStack_128;
  undefined4 uStack_120;
  undefined8 uStack_11c;
  undefined8 local_114;
  undefined8 uStack_10c;
  undefined8 local_104;
  undefined8 uStack_fc;
  undefined8 local_f4;
  undefined8 uStack_ec;
  undefined8 local_e4;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  directory_iterator local_c8;
  string local_b0;
  StringRef local_90;
  uint64_t local_80 [10];
  
  local_1f8.ctx = ti.ctx;
  local_1f8.impl = ti.impl;
  bVar17 = 0;
  KVar1 = (this->directoryValue).kind;
  if (KVar1 == ExistingInput) {
    this_01 = llbuild::buildsystem::BuildValue::getOutputInfo(&this->directoryValue);
    bVar6 = llbuild::basic::FileInfo::isDirectory(this_01);
    if (bVar6) {
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90.Data = (this->path)._M_dataplus._M_p;
      local_90.Length = (this->path)._M_string_length;
      llbuild::basic::StringList::getValues(&local_150,&this->filters);
      local_1e8._M_value = 0;
      local_1e8._M_cat = (error_category *)std::_V2::system_category();
      llvm::Twine::Twine((Twine *)&local_138,&local_90);
      lVar10 = 1;
      llvm::sys::fs::directory_iterator::directory_iterator
                (&local_1b8,(Twine *)&local_138,&local_1e8,true);
      local_c8.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_c8.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8.FollowSymlinks = true;
      local_c8._17_7_ = 0;
      bVar6 = llvm::sys::fs::directory_iterator::operator==(&local_1b8,&local_c8);
      CVar11._4_4_ = local_138._4_4_;
      CVar11.decUI = local_138.decUI;
      if ((!bVar6) && (local_138 = CVar11, local_1e8._M_value == 0)) {
        do {
          CVar11.twine = (Twine *)&CStack_128;
          SVar18.Length = 2;
          SVar18.Data = (char *)((local_1b8.State.
                                  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->CurrentEntry).Path._M_string_length;
          SVar18 = llvm::sys::path::filename
                             ((path *)((local_1b8.State.
                                        super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->CurrentEntry).Path._M_dataplus._M_p,SVar18,
                              (Style)lVar10);
          pcVar8 = SVar18.Data;
          if (pcVar8 == (char *)0x0) {
            uStack_130 = 0;
            uStack_12c = 0;
            CStack_128.decUI = CStack_128.decUI & 0xffffff00;
          }
          else {
            local_138.twine = CVar11.twine;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,pcVar8,pcVar8 + SVar18.Length);
            CVar11 = local_138;
          }
          pSVar5 = local_150.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pSVar2 = local_150.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_150.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_150.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
LAB_0016c079:
            local_138 = CVar11;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_1d8,(value_type *)&local_138);
          }
          else {
            do {
              pSVar14 = pSVar2 + 1;
              local_138 = CVar11;
              std::__cxx11::string::string((string *)local_1a0,pSVar2->Data,&local_1f9);
              std::__cxx11::string::string((string *)&local_b0,local_138.cString,&local_1fa);
              MVar7 = llbuild::basic::sys::filenameMatch((string *)local_1a0,&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              CVar11 = local_138;
              if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
                operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
                CVar11 = local_138;
              }
              lVar10 = 1;
            } while ((MVar7 != MATCH) && (lVar10 = 0, pSVar2 = pSVar14, pSVar14 != pSVar5));
            local_138 = CVar11;
            if (lVar10 == 0) goto LAB_0016c079;
          }
          if (&(local_138.twine)->LHS != &CStack_128) {
            operator_delete(local_138.twine,CONCAT44(CStack_128._4_4_,CStack_128.decUI) + 1);
          }
          eVar19 = llvm::sys::fs::detail::directory_iterator_increment
                             (local_1b8.State.
                              super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          local_1e8._M_cat = eVar19._M_cat;
          local_1e8._M_value = eVar19._M_value;
          llvm::sys::fs::directory_iterator::update_error_code_for_current_entry
                    (&local_1b8,&local_1e8);
          this_00 = &local_1b8.State.
                     super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_00,this_00);
          bVar6 = llvm::sys::fs::directory_iterator::operator==(&local_1b8,&local_c8);
        } while ((!bVar6) && (local_1e8._M_value == 0));
      }
      if (local_c8.State.
          super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.State.
                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_1b8.State.
          super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b8.State.
                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pbVar4 = local_1d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_1d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar15 = (long)local_1d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = lVar15 >> 5;
        lVar10 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                  (local_1d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_1d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar15 < 0x201) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                    (pbVar3,pbVar4);
        }
        else {
          pbVar16 = pbVar3 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                    (pbVar3,pbVar16);
          for (; pbVar16 != pbVar4; pbVar16 = pbVar16 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::FilteredDirectoryContentsTask::getFilteredContents(llvm::StringRef,llbuild::basic::StringList_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>>
                      (pbVar16);
          }
        }
      }
      if (local_150.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.
                        super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.
                              super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.
                              super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      values.Length =
           (long)local_1d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
      values.Data = local_1d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      llbuild::buildsystem::BuildValue::BuildValue
                ((BuildValue *)&local_138,FilteredDirectoryContents,values);
      llbuild::buildsystem::BuildValue::toData((ValueType *)local_1a0,(BuildValue *)&local_138);
      llbuild::core::TaskInterface::complete(&local_1f8,(ValueType *)local_1a0,false);
      if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ - local_1a0._0_8_);
      }
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8);
      return;
    }
    puVar12 = local_80;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar12 = this_01->device;
      this_01 = (FileInfo *)((long)this_01 + (ulong)bVar17 * -0x10 + 8);
      puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
    }
    puVar12 = local_80;
    pFVar13 = (FileInfo *)local_1a0;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      pFVar13->device = *puVar12;
      puVar12 = puVar12 + (ulong)bVar17 * -2 + 1;
      pFVar13 = (FileInfo *)((long)pFVar13 + (ulong)bVar17 * -0x10 + 8);
    }
    if (((((pointer)local_1a0._0_8_ == (pointer)0x0) && ((pointer)local_1a0._8_8_ == (pointer)0x0))
        && (local_1a0._16_8_ == 0)) &&
       (((local_1a0._24_8_ == 0 && (local_180 == 0)) && (local_178 == 0)))) {
      __assert_fail("!outputInfo.isMissing()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                    ,0x113,
                    "static BuildValue llbuild::buildsystem::BuildValue::makeExistingInput(FileInfo)"
                   );
    }
    outputInfos.Length = 1;
    outputInfos.Data = (FileInfo *)local_1a0;
    llbuild::buildsystem::BuildValue::BuildValue
              ((BuildValue *)&local_138,ExistingInput,outputInfos,(CommandSignature)0x0);
    llbuild::buildsystem::BuildValue::toData((ValueType *)local_1a0,(BuildValue *)&local_138);
    llbuild::core::TaskInterface::complete(&local_1f8,(ValueType *)local_1a0,false);
  }
  else {
    if (KVar1 == MissingInput) {
      local_138.decUI = 3;
    }
    else {
      local_138.decUI = 9;
    }
    local_138._4_4_ = 0;
    uStack_130 = 0;
    uStack_12c = 0;
    CStack_128.decUI = 0;
    CStack_128._4_4_ = 0;
    uStack_120 = 0;
    uStack_11c = 0;
    local_114 = 0;
    uStack_10c = 0;
    local_104 = 0;
    uStack_fc = 0;
    local_f4 = 0;
    uStack_ec = 0;
    local_e4 = 0;
    uStack_dc = 0;
    uStack_d8 = 0;
    uStack_d4 = 0;
    uStack_d0 = 0;
    llbuild::buildsystem::BuildValue::toData((ValueType *)local_1a0,(BuildValue *)&local_138);
    llbuild::core::TaskInterface::complete(&local_1f8,(ValueType *)local_1a0,false);
  }
  if ((pointer)local_1a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ - local_1a0._0_8_);
  }
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_138);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    if (directoryValue.isMissingInput()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (!directoryValue.isExistingInput()) {
      ti.complete(BuildValue::makeFailedInput().toData());
      return;
    }

    auto& info = directoryValue.getOutputInfo();

    // Non-directory things are just plain-ol' inputs
    if (!info.isDirectory()) {
      ti.complete(BuildValue::makeExistingInput(info).toData());
      return;
    }

    // Collect the filtered contents
    std::vector<std::string> filenames;
    getFilteredContents(path, filters, filenames);

    // Create the result.
    ti.complete(BuildValue::makeFilteredDirectoryContents(filenames).toData());
  }